

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O2

void __thiscall iutest::detail::IParamTestSuiteInfo::~IParamTestSuiteInfo(IParamTestSuiteInfo *this)

{
  this->_vptr_IParamTestSuiteInfo = (_func_int **)&PTR__IParamTestSuiteInfo_001c0e88;
  std::__cxx11::string::~string((string *)&this->m_package_name);
  std::__cxx11::string::~string((string *)&this->m_testsuite_base_name);
  std::
  _Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
  ::~_Vector_base(&(this->m_testinfos).
                   super__Vector_base<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
                 );
  return;
}

Assistant:

virtual ~IParamTestSuiteInfo() {}